

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

Span<char> __thiscall
absl::cord_internal::CordRepBtree::GetAppendBufferSlow(CordRepBtree *this,size_t size)

{
  CordRep *this_00;
  CordRepBtree *pCVar1;
  uint8_t *puVar2;
  CordRepFlat *pCVar3;
  size_t sVar4;
  int i_1;
  int i;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  Span<char> SVar8;
  CordRepBtree *stack [12];
  undefined8 local_98 [13];
  
  if ((this->super_CordRep).storage[0] < 4) {
    __assert_fail("height() >= 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O2/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x3f3,"Span<char> absl::cord_internal::CordRepBtree::GetAppendBufferSlow(size_t)"
                 );
  }
  if ((this->super_CordRep).refcount.count_.super___atomic_base<int>._M_i != 2) {
    __assert_fail("refcount.IsOne()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O2/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x3f4,"Span<char> absl::cord_internal::CordRepBtree::GetAppendBufferSlow(size_t)"
                 );
  }
  uVar6 = (ulong)(this->super_CordRep).storage[0];
  sVar7 = 0;
  uVar5 = 0;
  pCVar1 = this;
  do {
    this_00 = *(CordRep **)
               ((pCVar1->super_CordRep).storage + (ulong)(pCVar1->super_CordRep).storage[2] * 8 + -5
               );
    if (uVar6 == uVar5) {
      sVar7 = 0;
      puVar2 = (uint8_t *)0x0;
      if ((this_00->refcount).count_.super___atomic_base<int>._M_i == 2) {
        sVar7 = 0;
        puVar2 = (uint8_t *)0x0;
        if (5 < this_00->tag) {
          pCVar3 = CordRep::flat(this_00);
          sVar4 = CordRepFlat::Capacity(pCVar3);
          sVar7 = 0;
          puVar2 = (uint8_t *)0x0;
          uVar5 = sVar4 - this_00->length;
          if (uVar5 != 0) {
            sVar7 = size;
            if (uVar5 < size) {
              sVar7 = uVar5;
            }
            pCVar3 = CordRep::flat(this_00);
            sVar4 = this_00->length;
            this_00->length = sVar4 + sVar7;
            (this->super_CordRep).length = (this->super_CordRep).length + sVar7;
            for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
              *(long *)local_98[uVar5] = *(long *)local_98[uVar5] + sVar7;
            }
            puVar2 = (pCVar3->super_CordRep).storage + sVar4;
          }
        }
      }
LAB_0015d8cc:
      SVar8.len_ = sVar7;
      SVar8.ptr_ = (pointer)puVar2;
      return SVar8;
    }
    pCVar1 = CordRep::btree(this_00);
    if ((pCVar1->super_CordRep).refcount.count_.super___atomic_base<int>._M_i != 2) {
      puVar2 = (uint8_t *)0x0;
      goto LAB_0015d8cc;
    }
    local_98[uVar5] = pCVar1;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

Span<char> CordRepBtree::GetAppendBufferSlow(size_t size) {
  // The inlined version in `GetAppendBuffer()` deals with all heights <= 3.
  assert(height() >= 4);
  assert(refcount.IsOne());

  // Build a stack of nodes we may potentially need to update if we find a
  // non-shared FLAT with capacity at the leaf level.
  const int depth = height();
  CordRepBtree* node = this;
  CordRepBtree* stack[kMaxDepth];
  for (int i = 0; i < depth; ++i) {
    node = node->Edge(kBack)->btree();
    if (!node->refcount.IsOne()) return {};
    stack[i] = node;
  }

  // Must be a privately owned, mutable flat.
  CordRep* const edge = node->Edge(kBack);
  if (!edge->refcount.IsOne() || edge->tag < FLAT) return {};

  // Must have capacity.
  const size_t avail = edge->flat()->Capacity() - edge->length;
  if (avail == 0) return {};

  // Build span on remaining capacity.
  size_t delta = (std::min)(size, avail);
  Span<char> span = {edge->flat()->Data() + edge->length, delta};
  edge->length += delta;
  this->length += delta;
  for (int i = 0; i < depth; ++i) {
    stack[i]->length += delta;
  }
  return span;
}